

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O0

wchar_t lzx_huffman_init(huffman *hf,size_t len_size,wchar_t tbl_bits)

{
  void *pvVar1;
  int in_EDX;
  size_t in_RSI;
  int *in_RDI;
  wchar_t bits;
  int local_20;
  
  if ((*(long *)(in_RDI + 0x12) == 0) || (*in_RDI != (int)in_RSI)) {
    free(*(void **)(in_RDI + 0x12));
    pvVar1 = calloc(in_RSI,1);
    *(void **)(in_RDI + 0x12) = pvVar1;
    if (*(long *)(in_RDI + 0x12) == 0) {
      return L'\xffffffe2';
    }
    *in_RDI = (int)in_RSI;
  }
  else {
    memset(*(void **)(in_RDI + 0x12),0,in_RSI);
  }
  if (*(long *)(in_RDI + 0x1a) == 0) {
    local_20 = in_EDX;
    if (9 < in_EDX) {
      local_20 = 10;
    }
    pvVar1 = malloc((1L << ((byte)local_20 & 0x3f)) << 1);
    *(void **)(in_RDI + 0x1a) = pvVar1;
    if (*(long *)(in_RDI + 0x1a) == 0) {
      return L'\xffffffe2';
    }
    in_RDI[0x16] = in_EDX;
  }
  if ((*(long *)(in_RDI + 0x1c) == 0) && (10 < in_EDX)) {
    in_RDI[0x18] = 1 << ((char)in_EDX - 6U & 0x1f);
    pvVar1 = malloc((long)in_RDI[0x18] << 2);
    *(void **)(in_RDI + 0x1c) = pvVar1;
    if (*(long *)(in_RDI + 0x1c) == 0) {
      return L'\xffffffe2';
    }
  }
  return L'\0';
}

Assistant:

static int
lzx_huffman_init(struct huffman *hf, size_t len_size, int tbl_bits)
{
	int bits;

	if (hf->bitlen == NULL || hf->len_size != (int)len_size) {
		free(hf->bitlen);
		hf->bitlen = calloc(len_size,  sizeof(hf->bitlen[0]));
		if (hf->bitlen == NULL)
			return (ARCHIVE_FATAL);
		hf->len_size = (int)len_size;
	} else
		memset(hf->bitlen, 0, len_size *  sizeof(hf->bitlen[0]));
	if (hf->tbl == NULL) {
		if (tbl_bits < HTBL_BITS)
			bits = tbl_bits;
		else
			bits = HTBL_BITS;
		hf->tbl = malloc(((size_t)1 << bits) * sizeof(hf->tbl[0]));
		if (hf->tbl == NULL)
			return (ARCHIVE_FATAL);
		hf->tbl_bits = tbl_bits;
	}
	if (hf->tree == NULL && tbl_bits > HTBL_BITS) {
		hf->tree_avail = 1 << (tbl_bits - HTBL_BITS + 4);
		hf->tree = malloc(hf->tree_avail * sizeof(hf->tree[0]));
		if (hf->tree == NULL)
			return (ARCHIVE_FATAL);
	}
	return (ARCHIVE_OK);
}